

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

Block * __thiscall Block::GetMerkleRoot_abi_cxx11_(Block *this)

{
  long in_RSI;
  Block *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x40));
  return this;
}

Assistant:

string Block::GetMerkleRoot() const {
    return merkle_root;
}